

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

Atom writeTargetToProperty(XSelectionRequestEvent *request)

{
  Window WVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Atom AVar4;
  Atom AVar5;
  Display *pDVar6;
  char *pcVar7;
  unsigned_long uVar8;
  size_t sVar9;
  int local_84;
  int j;
  unsigned_long count;
  unsigned_long i_1;
  Atom *targets_1;
  Atom targets [5];
  Atom AStack_38;
  int formatCount;
  Atom formats [3];
  int i;
  XSelectionRequestEvent *request_local;
  
  pcVar7 = _glfw.x11.clipboardString;
  pDVar6 = _glfw.x11.display;
  AStack_38 = _glfw.x11.UTF8_STRING;
  formats[0] = _glfw.x11.COMPOUND_STRING;
  formats[1] = 0x1f;
  targets[4]._4_4_ = 3;
  if (request->property == 0) {
    request_local = (XSelectionRequestEvent *)0x0;
  }
  else if (request->target == _glfw.x11.TARGETS) {
    targets_1 = (Atom *)_glfw.x11.TARGETS;
    targets[0] = _glfw.x11.MULTIPLE;
    targets[1] = _glfw.x11.UTF8_STRING;
    targets[2] = _glfw.x11.COMPOUND_STRING;
    targets[3] = 0x1f;
    XChangeProperty(_glfw.x11.display,request->requestor,request->property,4,0x20,0,&targets_1,5);
    request_local = (XSelectionRequestEvent *)request->property;
  }
  else if (request->target == _glfw.x11.MULTIPLE) {
    uVar8 = _glfwGetWindowPropertyX11
                      (request->requestor,request->property,_glfw.x11.ATOM_PAIR,(uchar **)&i_1);
    for (count = 0; pcVar7 = _glfw.x11.clipboardString, pDVar6 = _glfw.x11.display, count < uVar8;
        count = count + 2) {
      local_84 = 0;
      while ((local_84 < 3 &&
             (*(long *)(i_1 + count * 8) !=
              *(long *)((long)&stack0xffffffffffffffc8 + (long)local_84 * 8)))) {
        local_84 = local_84 + 1;
      }
      if (local_84 < 3) {
        WVar1 = request->requestor;
        uVar2 = *(undefined8 *)(i_1 + 8 + count * 8);
        uVar3 = *(undefined8 *)(i_1 + count * 8);
        sVar9 = strlen(_glfw.x11.clipboardString);
        XChangeProperty(pDVar6,WVar1,uVar2,uVar3,8,0,pcVar7,(int)sVar9);
      }
      else {
        *(undefined8 *)(i_1 + 8 + count * 8) = 0;
      }
    }
    XChangeProperty(_glfw.x11.display,request->requestor,request->property,_glfw.x11.ATOM_PAIR,0x20,
                    0,i_1,(int)uVar8);
    XFree(i_1);
    request_local = (XSelectionRequestEvent *)request->property;
  }
  else if (request->target == _glfw.x11.SAVE_TARGETS) {
    XChangeProperty(_glfw.x11.display,request->requestor,request->property,_glfw.x11.NULL_,0x20,0,0,
                    0);
    request_local = (XSelectionRequestEvent *)request->property;
  }
  else {
    for (formats[2]._4_4_ = 0; formats[2]._4_4_ < 3; formats[2]._4_4_ = formats[2]._4_4_ + 1) {
      if (request->target == *(Atom *)((long)&stack0xffffffffffffffc8 + (long)formats[2]._4_4_ * 8))
      {
        WVar1 = request->requestor;
        AVar4 = request->property;
        AVar5 = request->target;
        sVar9 = strlen(_glfw.x11.clipboardString);
        XChangeProperty(pDVar6,WVar1,AVar4,AVar5,8,0,pcVar7,(int)sVar9);
        return request->property;
      }
    }
    request_local = (XSelectionRequestEvent *)0x0;
  }
  return (Atom)request_local;
}

Assistant:

static Atom writeTargetToProperty(const XSelectionRequestEvent* request)
{
    int i;
    const Atom formats[] = { _glfw.x11.UTF8_STRING,
                             _glfw.x11.COMPOUND_STRING,
                             XA_STRING };
    const int formatCount = sizeof(formats) / sizeof(formats[0]);

    if (request->property == None)
    {
        // The requester is a legacy client (ICCCM section 2.2)
        // We don't support legacy clients, so fail here
        return None;
    }

    if (request->target == _glfw.x11.TARGETS)
    {
        // The list of supported targets was requested

        const Atom targets[] = { _glfw.x11.TARGETS,
                                 _glfw.x11.MULTIPLE,
                                 _glfw.x11.UTF8_STRING,
                                 _glfw.x11.COMPOUND_STRING,
                                 XA_STRING };

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        XA_ATOM,
                        32,
                        PropModeReplace,
                        (unsigned char*) targets,
                        sizeof(targets) / sizeof(targets[0]));

        return request->property;
    }

    if (request->target == _glfw.x11.MULTIPLE)
    {
        // Multiple conversions were requested

        Atom* targets;
        unsigned long i, count;

        count = _glfwGetWindowPropertyX11(request->requestor,
                                          request->property,
                                          _glfw.x11.ATOM_PAIR,
                                          (unsigned char**) &targets);

        for (i = 0;  i < count;  i += 2)
        {
            int j;

            for (j = 0;  j < formatCount;  j++)
            {
                if (targets[i] == formats[j])
                    break;
            }

            if (j < formatCount)
            {
                XChangeProperty(_glfw.x11.display,
                                request->requestor,
                                targets[i + 1],
                                targets[i],
                                8,
                                PropModeReplace,
                                (unsigned char*) _glfw.x11.clipboardString,
                                strlen(_glfw.x11.clipboardString));
            }
            else
                targets[i + 1] = None;
        }

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        _glfw.x11.ATOM_PAIR,
                        32,
                        PropModeReplace,
                        (unsigned char*) targets,
                        count);

        XFree(targets);

        return request->property;
    }

    if (request->target == _glfw.x11.SAVE_TARGETS)
    {
        // The request is a check whether we support SAVE_TARGETS
        // It should be handled as a no-op side effect target

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        _glfw.x11.NULL_,
                        32,
                        PropModeReplace,
                        NULL,
                        0);

        return request->property;
    }

    // Conversion to a data target was requested

    for (i = 0;  i < formatCount;  i++)
    {
        if (request->target == formats[i])
        {
            // The requested target is one we support

            XChangeProperty(_glfw.x11.display,
                            request->requestor,
                            request->property,
                            request->target,
                            8,
                            PropModeReplace,
                            (unsigned char*) _glfw.x11.clipboardString,
                            strlen(_glfw.x11.clipboardString));

            return request->property;
        }
    }

    // The requested target is not supported

    return None;
}